

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

uint64_t PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  long lVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LBitEntropy local_50;
  VP8LStreaks local_38;
  
  (*VP8LGetEntropyUnrefined)(population,length,&local_50,&local_38);
  if (trivial_sym != (uint32_t *)0x0) {
    uVar2 = 0xffffffff;
    if (local_50.nonzeros == 1) {
      uVar2 = local_50.nonzero_code;
    }
    *trivial_sym = uVar2;
  }
  *is_used = local_38.streaks[1][0] != 0 || local_38.streaks[1][1] != 0;
  lVar3 = 0x273;
  if (local_50.nonzeros < 5) {
    if (local_50.nonzeros < 2) {
      uVar4 = 0;
      goto LAB_00148bdd;
    }
    if (local_50.nonzeros == 3) {
      lVar3 = 0x3b6;
    }
    else {
      if (local_50.nonzeros == 2) {
        lVar1 = (ulong)local_50.sum * 0x31800000;
        lVar3 = lVar1 + local_50.entropy + 0x32;
        if ((long)(lVar1 + local_50.entropy) < 0) {
          lVar3 = lVar1 + local_50.entropy + -0x32;
        }
        uVar4 = lVar3 / 100;
        goto LAB_00148bdd;
      }
      lVar3 = 700;
    }
  }
  lVar1 = (ulong)(local_50.sum * 2 - local_50.max_val) * lVar3 * 0x800000;
  lVar5 = (1000 - lVar3) * local_50.entropy;
  lVar3 = lVar1 + lVar5 + 500;
  if (lVar1 + lVar5 < 0) {
    lVar3 = lVar1 + lVar5 + -500;
  }
  uVar4 = lVar3 / 1000;
  if ((ulong)(lVar3 / 1000) < local_50.entropy) {
    uVar4 = local_50.entropy;
  }
LAB_00148bdd:
  auVar6._8_4_ = 0xf0;
  auVar6._0_8_ = 0xa5000000a50;
  auVar6._12_4_ = 0xf0;
  return (ulong)(uint)((int)((auVar6._8_8_ & 0xffffffff) * (ulong)local_38.streaks[0][1]) +
                       local_38.counts[1] * 0xa50 +
                       (int)((local_38.streaks[0] & 0xffffffff) * 0x730) +
                       local_38.counts[0] * 0x640 +
                      local_38.streaks[1][0] * 0xd20 + local_38.streaks[1][1] * 0x2d0) * 0x2000 +
         uVar4 + 0x17f33333;
}

Assistant:

static uint64_t PopulationCost(const uint32_t* const population, int length,
                               uint32_t* const trivial_sym,
                               uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}